

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronParserCtxtPtr xmlSchematronNewDocParserCtxt(xmlDocPtr doc)

{
  xmlSchematronParserCtxtPtr ctxt;
  xmlDictPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  
  if (doc != (xmlDocPtr)0x0) {
    ctxt = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x90);
    if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema parser context");
      return (xmlSchematronParserCtxtPtr)0x0;
    }
    memset(ctxt,0,0x90);
    ctxt->doc = doc;
    pxVar1 = xmlDictCreate();
    ctxt->dict = pxVar1;
    ctxt->preserve = 1;
    pxVar2 = xmlXPathNewContext(doc);
    ctxt->xctxt = pxVar2;
    if (pxVar2 != (xmlXPathContextPtr)0x0) {
      return ctxt;
    }
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema parser XPath context");
    xmlSchematronFreeParserCtxt(ctxt);
  }
  return (xmlSchematronParserCtxtPtr)0x0;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewDocParserCtxt(xmlDocPtr doc)
{
    xmlSchematronParserCtxtPtr ret;

    if (doc == NULL)
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->doc = doc;
    ret->dict = xmlDictCreate();
    /* The application has responsibility for the document */
    ret->preserve = 1;
    ret->xctxt = xmlXPathNewContext(doc);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
        xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }

    return (ret);
}